

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

size_t lua_objlen(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  int in_ESI;
  lua_State *in_RDI;
  StkId unaff_retaddr;
  lua_State *in_stack_00000008;
  size_t l;
  StkId o;
  Table *local_38;
  Table *in_stack_ffffffffffffffd8;
  Table *local_8;
  
  pTVar2 = index2adr(in_RDI,in_ESI);
  switch(pTVar2->tt) {
  case 3:
    iVar1 = luaV_tostring(in_stack_00000008,unaff_retaddr);
    if (iVar1 == 0) {
      local_38 = (Table *)0x0;
    }
    else {
      local_38 = (((pTVar2->value).gc)->h).metatable;
    }
    local_8 = local_38;
    break;
  case 4:
    local_8 = (((pTVar2->value).gc)->h).metatable;
    break;
  case 5:
    iVar1 = luaH_getn(in_stack_ffffffffffffffd8);
    local_8 = (Table *)(long)iVar1;
    break;
  default:
    local_8 = (Table *)0x0;
    break;
  case 7:
    local_8 = (Table *)(((pTVar2->value).gc)->h).node;
  }
  return (size_t)local_8;
}

Assistant:

static size_t lua_objlen(lua_State*L,int idx){
StkId o=index2adr(L,idx);
switch(ttype(o)){
case 4:return tsvalue(o)->len;
case 7:return uvalue(o)->len;
case 5:return luaH_getn(hvalue(o));
case 3:{
size_t l;
l=(luaV_tostring(L,o)?tsvalue(o)->len:0);
return l;
}
default:return 0;
}
}